

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_column_writer.cpp
# Opt level: O3

void __thiscall
duckdb::BooleanColumnWriter::WriteVector
          (BooleanColumnWriter *this,WriteStream *temp_writer,ColumnWriterStatistics *stats_p,
          ColumnWriterPageState *state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  byte *pbVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  byte bVar4;
  undefined8 in_RAX;
  byte bVar5;
  char cVar6;
  idx_t r;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  FlatVector::VerifyFlatVector(input_column);
  pdVar2 = input_column->data;
  if (((*(char *)((long)&stats_p[1]._vptr_ColumnWriterStatistics + 1) == '\x01') &&
      (*(char *)&stats_p[1]._vptr_ColumnWriterStatistics == '\0')) &&
     ((input_column->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0)) {
    if (chunk_start < chunk_end) {
      bVar4 = *(byte *)&state_p[1]._vptr_ColumnWriterPageState;
      bVar5 = *(byte *)((long)&state_p[1]._vptr_ColumnWriterPageState + 1);
      do {
        bVar4 = pdVar2[chunk_start] << (bVar5 & 0x1f) | bVar4;
        *(byte *)&state_p[1]._vptr_ColumnWriterPageState = bVar4;
        bVar5 = bVar5 + 1;
        *(byte *)((long)&state_p[1]._vptr_ColumnWriterPageState + 1) = bVar5;
        if (bVar5 == 8) {
          uStack_38._0_7_ = CONCAT16(bVar4,(undefined6)uStack_38);
          (**temp_writer->_vptr_WriteStream)(temp_writer,(long)&uStack_38 + 6,1);
          *(undefined2 *)&state_p[1]._vptr_ColumnWriterPageState = 0;
          bVar4 = 0;
          bVar5 = 0;
        }
        chunk_start = chunk_start + 1;
      } while (chunk_end != chunk_start);
    }
  }
  else if (chunk_start < chunk_end) {
    do {
      puVar3 = (input_column->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) ||
         ((puVar3[chunk_start >> 6] >> (chunk_start & 0x3f) & 1) != 0)) {
        pbVar1 = (byte *)((long)&stats_p[1]._vptr_ColumnWriterStatistics + 1);
        *pbVar1 = *pbVar1 | pdVar2[chunk_start];
        *(byte *)&stats_p[1]._vptr_ColumnWriterStatistics =
             *(byte *)&stats_p[1]._vptr_ColumnWriterStatistics & pdVar2[chunk_start];
        bVar4 = *(byte *)((long)&state_p[1]._vptr_ColumnWriterPageState + 1);
        bVar5 = pdVar2[chunk_start] << (bVar4 & 0x1f) |
                *(byte *)&state_p[1]._vptr_ColumnWriterPageState;
        *(byte *)&state_p[1]._vptr_ColumnWriterPageState = bVar5;
        cVar6 = bVar4 + 1;
        *(char *)((long)&state_p[1]._vptr_ColumnWriterPageState + 1) = cVar6;
        if (cVar6 == '\b') {
          uStack_38 = CONCAT17(bVar5,(undefined7)uStack_38);
          (**temp_writer->_vptr_WriteStream)(temp_writer,(long)&uStack_38 + 7,1);
          *(undefined2 *)&state_p[1]._vptr_ColumnWriterPageState = 0;
        }
      }
      chunk_start = chunk_start + 1;
    } while (chunk_end != chunk_start);
  }
  return;
}

Assistant:

void BooleanColumnWriter::WriteVector(WriteStream &temp_writer, ColumnWriterStatistics *stats_p,
                                      ColumnWriterPageState *state_p, Vector &input_column, idx_t chunk_start,
                                      idx_t chunk_end) {
	auto &stats = stats_p->Cast<BooleanStatisticsState>();
	auto &state = state_p->Cast<BooleanWriterPageState>();
	const auto &mask = FlatVector::Validity(input_column);

	const auto *const ptr = FlatVector::GetData<bool>(input_column);
	if (stats.max && !stats.min && mask.AllValid()) {
		// Fast path: stats have already been set, and there's no NULLs
		for (idx_t r = chunk_start; r < chunk_end; r++) {
			const auto &val = ptr[r];
			state.byte |= val << state.byte_pos;
			if (++state.byte_pos == 8) {
				temp_writer.Write(state.byte);
				state.byte = 0;
				state.byte_pos = 0;
			}
		}
	} else {
		for (idx_t r = chunk_start; r < chunk_end; r++) {
			if (!mask.RowIsValid(r)) {
				continue;
			}
			const auto &val = ptr[r];

			stats.max |= val;
			stats.min &= val;
			state.byte |= val << state.byte_pos;

			if (++state.byte_pos == 8) {
				temp_writer.Write(state.byte);
				state.byte = 0;
				state.byte_pos = 0;
			}
		}
	}
}